

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall
t_lua_generator::generate_deserialize_map_element
          (t_lua_generator *this,ostream *out,t_map *tmap,string *prefix)

{
  t_type *ptVar1;
  ostream *poVar2;
  allocator local_289;
  string val;
  string key;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  t_field fkey;
  t_field fval;
  
  std::__cxx11::string::string((string *)&local_1a8,"_key",(allocator *)&fkey);
  t_generator::tmp(&key,(t_generator *)this,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1c8,"_val",(allocator *)&fkey);
  t_generator::tmp(&val,(t_generator *)this,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  ptVar1 = tmap->key_type_;
  std::__cxx11::string::string((string *)&local_1e8,(string *)&key);
  t_field::t_field(&fkey,ptVar1,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  ptVar1 = tmap->val_type_;
  std::__cxx11::string::string((string *)&local_208,(string *)&val);
  t_field::t_field(&fval,ptVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::string((string *)&local_228,"",&local_289);
  generate_deserialize_field(this,out,&fkey,true,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_248,"",&local_289);
  generate_deserialize_field(this,out,&fval,true,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,"[");
  poVar2 = std::operator<<(poVar2,(string *)&key);
  poVar2 = std::operator<<(poVar2,"] = ");
  poVar2 = std::operator<<(poVar2,(string *)&val);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_field::~t_field(&fval);
  t_field::~t_field(&fkey);
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)&key);
  return;
}

Assistant:

void t_lua_generator::generate_deserialize_map_element(ostream& out, t_map* tmap, string prefix) {
  // A map is represented by a table indexable by any lua type
  string key = tmp("_key");
  string val = tmp("_val");
  t_field fkey(tmap->get_key_type(), key);
  t_field fval(tmap->get_val_type(), val);

  generate_deserialize_field(out, &fkey, true);
  generate_deserialize_field(out, &fval, true);

  indent(out) << prefix << "[" << key << "] = " << val << endl;
}